

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Orphan<capnp::DynamicStruct> * __thiscall
capnp::Orphanage::newOrphan
          (Orphan<capnp::DynamicStruct> *__return_storage_ptr__,Orphanage *this,StructSchema schema)

{
  BuilderArena *arena;
  CapTableBuilder *capTable;
  StructSize size;
  word in_stack_ffffffffffffffb8;
  SegmentBuilder *local_40;
  CapTableBuilder *pCStack_38;
  word *local_30;
  
  arena = this->arena;
  capTable = this->capTable;
  size = anon_unknown_71::structSizeFromSchema((StructSchema)in_stack_ffffffffffffffb8.content);
  capnp::_::OrphanBuilder::initStruct((OrphanBuilder *)&stack0xffffffffffffffb8,arena,capTable,size)
  ;
  (__return_storage_ptr__->schema).super_Schema.raw = (RawBrandedSchema *)schema.super_Schema.raw;
  (__return_storage_ptr__->builder).segment = local_40;
  (__return_storage_ptr__->builder).capTable = pCStack_38;
  (__return_storage_ptr__->builder).location = local_30;
  (__return_storage_ptr__->builder).tag.content = in_stack_ffffffffffffffb8.content;
  capnp::_::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&stack0xffffffffffffffb8);
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicStruct> Orphanage::newOrphan(StructSchema schema) const {
  return Orphan<DynamicStruct>(
      schema, _::OrphanBuilder::initStruct(arena, capTable, structSizeFromSchema(schema)));
}